

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBlocker.cpp
# Opt level: O2

void __thiscall tiger::trains::ai::LineBlocker::makeOwnBlockLines(LineBlocker *this)

{
  set<tiger::trains::ai::LineBlock,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
  *this_00;
  set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  *psVar1;
  Train *otherTrain;
  IPost *pIVar2;
  pointer ppLVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  World *this_01;
  _Base_ptr p_Var8;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *pvVar9;
  Line *pLVar10;
  Line *pLVar11;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *pvVar12;
  undefined4 extraout_var;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *pvVar13;
  pointer ppTVar14;
  pointer ppLVar15;
  pointer ppTVar16;
  pointer ppIVar17;
  pair<int,_tiger::trains::ai::LineBlock> blockLine;
  CollisionAllower allower;
  undefined1 local_68 [16];
  _Base_ptr local_58;
  pointer local_50;
  LineBlocker *local_48;
  World *local_40;
  CollisionAllower local_38;
  
  CollisionAllower::CollisionAllower(&local_38);
  this_01 = world::Train::getWorld(this->train);
  this_00 = &this->ownBlockLine;
  std::
  _Rb_tree<tiger::trains::ai::LineBlock,_tiger::trains::ai::LineBlock,_std::_Identity<tiger::trains::ai::LineBlock>,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
  ::clear(&this_00->_M_t);
  psVar1 = this->blockLines;
  local_48 = this;
  for (p_Var8 = (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    local_68._0_8_ = *(undefined8 *)(p_Var8 + 1);
    local_68._8_8_ = p_Var8[1]._M_parent;
    local_58 = p_Var8[1]._M_left;
    uVar4 = local_68._0_4_;
    iVar6 = world::Train::getIdx(local_48->train);
    if (uVar4 != iVar6) {
      std::
      _Rb_tree<tiger::trains::ai::LineBlock,tiger::trains::ai::LineBlock,std::_Identity<tiger::trains::ai::LineBlock>,std::less<tiger::trains::ai::LineBlock>,std::allocator<tiger::trains::ai::LineBlock>>
      ::_M_insert_unique<tiger::trains::ai::LineBlock_const&>
                ((_Rb_tree<tiger::trains::ai::LineBlock,tiger::trains::ai::LineBlock,std::_Identity<tiger::trains::ai::LineBlock>,std::less<tiger::trains::ai::LineBlock>,std::allocator<tiger::trains::ai::LineBlock>>
                  *)this_00,(LineBlock *)(local_68 + 8));
    }
  }
  local_40 = this_01;
  pvVar9 = world::World::getTrainList(this_01);
  ppTVar14 = (pvVar9->
             super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = ppTVar14;
  for (ppTVar16 = (pvVar9->
                  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppTVar16 != ppTVar14;
      ppTVar16 = ppTVar16 + 1) {
    otherTrain = *ppTVar16;
    bVar5 = CollisionAllower::isCollisionAllow(&local_38,local_48->train,otherTrain);
    if (bVar5) {
      pLVar10 = world::Train::getLine(otherTrain);
      pLVar11 = world::Train::getLine(otherTrain);
      local_68._8_8_ = world::Line::getStartPont(pLVar11);
      local_68._0_8_ = pLVar10;
      std::
      _Rb_tree<tiger::trains::ai::LineBlock,_tiger::trains::ai::LineBlock,_std::_Identity<tiger::trains::ai::LineBlock>,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
      ::_M_insert_unique<tiger::trains::ai::LineBlock>(&this_00->_M_t,(LineBlock *)local_68);
      pLVar10 = world::Train::getLine(otherTrain);
      pLVar11 = world::Train::getLine(otherTrain);
      local_68._8_8_ = world::Line::getEndPont(pLVar11);
      ppTVar14 = local_50;
      local_68._0_8_ = pLVar10;
      std::
      _Rb_tree<tiger::trains::ai::LineBlock,_tiger::trains::ai::LineBlock,_std::_Identity<tiger::trains::ai::LineBlock>,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
      ::_M_insert_unique<tiger::trains::ai::LineBlock>(&this_00->_M_t,(LineBlock *)local_68);
    }
  }
  pvVar12 = world::World::getPostList(local_40);
  local_50 = (pointer)(pvVar12->
                      super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar17 = (pvVar12->
                  super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; (pointer)ppIVar17 != local_50;
      ppIVar17 = ppIVar17 + 1) {
    pIVar2 = *ppIVar17;
    iVar6 = (*pIVar2->_vptr_IPost[7])(pIVar2);
    if (iVar6 != 1) {
      iVar7 = (*pIVar2->_vptr_IPost[7])(pIVar2);
      iVar6 = (uint)(local_48->type == ARMOR) * 3;
      if (local_48->type == PRODUCT) {
        iVar6 = 2;
      }
      if (iVar7 != iVar6) {
        iVar6 = (*pIVar2->_vptr_IPost[5])(pIVar2);
        pvVar13 = world::Point::getEdges((Point *)CONCAT44(extraout_var,iVar6));
        ppLVar3 = (pvVar13->
                  super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        for (ppLVar15 = (pvVar13->
                        super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppLVar15 != ppLVar3;
            ppLVar15 = ppLVar15 + 1) {
          pLVar10 = *ppLVar15;
          local_68._8_8_ = world::Line::getStartPont(pLVar10);
          local_68._0_8_ = pLVar10;
          std::
          _Rb_tree<tiger::trains::ai::LineBlock,_tiger::trains::ai::LineBlock,_std::_Identity<tiger::trains::ai::LineBlock>,_std::less<tiger::trains::ai::LineBlock>,_std::allocator<tiger::trains::ai::LineBlock>_>
          ::_M_insert_unique<tiger::trains::ai::LineBlock>(&this_00->_M_t,(LineBlock *)local_68);
        }
      }
    }
  }
  return;
}

Assistant:

void LineBlocker::makeOwnBlockLines()
{
    CollisionAllower allower;

    world::World *world = train->getWorld();


    ownBlockLine.clear();

    for (auto blockLine: *blockLines)
    {
        if (blockLine.first != train->getIdx())
        {
            ownBlockLine.insert(blockLine.second);
        }
    }

    for(auto trainA : world->getTrainList())
    {

        if (allower.isCollisionAllow(train, trainA))
        {
            ownBlockLine.insert({trainA->getLine(),trainA->getLine()->getStartPont()});
            ownBlockLine.insert({trainA->getLine(),trainA->getLine()->getEndPont()});
        }

    }

    for(auto post : world->getPostList())

    {
        if (post->getPostType() == models::PostType::TOWN ||
                post->getPostType() == getPostTypeByGood(type))
            continue;

        for (auto line : post->getPoint()->getEdges())
        {
            ownBlockLine.insert({line, line->getStartPont()});
        }
    }
}